

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  long lVar1;
  sxi32 sVar2;
  jx9_value *pObj_00;
  bool bVar3;
  jx9_value *pObj_1;
  jx9_vm_func *pFunc;
  GenBlock *pBlock;
  jx9_value *pjStack_38;
  sxu32 nIdx;
  SyString *pStr;
  jx9_value *pObj;
  SyToken *pToken;
  jx9_gen_state *pjStack_18;
  sxi32 iCompileFlag_local;
  jx9_gen_state *pGen_local;
  
  pjStack_38 = (jx9_value *)pGen->pIn;
  pObj = pjStack_38;
  pToken._4_4_ = iCompileFlag;
  pjStack_18 = pGen;
  if (pjStack_38->iFlags == 4) {
    sVar2 = SyStrnicmp((char *)(pjStack_38->x).pOther,"null",4);
    if (sVar2 == 0) {
      jx9VmEmitInstr(pjStack_18->pVm,4,0,0,(void *)0x0,(sxu32 *)0x0);
      return 0;
    }
    sVar2 = SyStrnicmp((char *)(pjStack_38->x).pOther,"true",4);
    if (sVar2 == 0) {
      jx9VmEmitInstr(pjStack_18->pVm,4,0,1,(void *)0x0,(sxu32 *)0x0);
      return 0;
    }
  }
  else {
    if ((pjStack_38->iFlags == 5) &&
       (sVar2 = SyStrnicmp((char *)(pjStack_38->x).pOther,"false",5), sVar2 == 0)) {
      jx9VmEmitInstr(pjStack_18->pVm,4,0,2,(void *)0x0,(sxu32 *)0x0);
      return 0;
    }
    if ((pjStack_38->iFlags == 8) &&
       (sVar2 = SyMemcmp((pjStack_38->x).pOther,"__LINE__",8), sVar2 == 0)) {
      pStr = (SyString *)jx9VmReserveConstObj(pjStack_18->pVm,(sxu32 *)((long)&pBlock + 4));
      if ((jx9_value *)pStr == (jx9_value *)0x0) {
        pToken._4_4_ = 0;
        sVar2 = GenStateOutOfMem(pjStack_18);
        return sVar2;
      }
      jx9MemObjInitFromInt(pjStack_18->pVm,(jx9_value *)pStr,(ulong)*(uint *)((long)&pObj->pVm + 4))
      ;
      jx9VmEmitInstr(pjStack_18->pVm,4,0,pBlock._4_4_,(void *)0x0,(sxu32 *)0x0);
      return 0;
    }
    if ((pjStack_38->iFlags == 0xc) &&
       (sVar2 = SyMemcmp((pjStack_38->x).pOther,"__FUNCTION__",0xc), sVar2 == 0)) {
      pFunc = (jx9_vm_func *)pjStack_18->pCurrent;
      while( true ) {
        bVar3 = false;
        if (pFunc != (jx9_vm_func *)0x0) {
          bVar3 = ((pFunc->aArgs).nSize & 8) == 0;
        }
        if (!bVar3) break;
        pFunc = (jx9_vm_func *)(pFunc->aArgs).pBase;
      }
      if (pFunc == (jx9_vm_func *)0x0) {
        jx9VmEmitInstr(pjStack_18->pVm,4,0,0,(void *)0x0,(sxu32 *)0x0);
      }
      else {
        lVar1 = *(long *)&(pFunc->aStatic).eSize;
        pStr = (SyString *)jx9VmReserveConstObj(pjStack_18->pVm,(sxu32 *)((long)&pBlock + 4));
        if ((jx9_value *)pStr == (jx9_value *)0x0) {
          sVar2 = GenStateOutOfMem(pjStack_18);
          return sVar2;
        }
        jx9MemObjInitFromString(pjStack_18->pVm,(jx9_value *)pStr,(SyString *)(lVar1 + 0x50));
        jx9VmEmitInstr(pjStack_18->pVm,4,0,pBlock._4_4_,(void *)0x0,(sxu32 *)0x0);
      }
      return 0;
    }
  }
  sVar2 = GenStateFindLiteral(pjStack_18,(SyString *)pObj,(sxu32 *)((long)&pBlock + 4));
  if (sVar2 != 0) {
    pObj_00 = jx9VmReserveConstObj(pjStack_18->pVm,(sxu32 *)((long)&pBlock + 4));
    if (pObj_00 == (jx9_value *)0x0) {
      sVar2 = GenStateOutOfMem(pjStack_18);
      return sVar2;
    }
    jx9MemObjInitFromString(pjStack_18->pVm,pObj_00,(SyString *)pObj);
    GenStateInstallLiteral(pjStack_18,pObj_00,pBlock._4_4_);
  }
  jx9VmEmitInstr(pjStack_18->pVm,4,1,pBlock._4_4_,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileLiteral(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyToken *pToken = pGen->pIn;
	jx9_value *pObj;
	SyString *pStr;	
	sxu32 nIdx;
	/* Extract token value */
	pStr = &pToken->sData;
	/* Deal with the reserved literals [i.e: null, false, true, ...] first */
	if( pStr->nByte == sizeof("NULL") - 1 ){
		if( SyStrnicmp(pStr->zString, "null", sizeof("NULL")-1) == 0 ){
			/* NULL constant are always indexed at 0 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
			return SXRET_OK;
		}else if( SyStrnicmp(pStr->zString, "true", sizeof("TRUE")-1) == 0 ){
			/* TRUE constant are always indexed at 1 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 1, 0, 0);
			return SXRET_OK;
		}
	}else if (pStr->nByte == sizeof("FALSE") - 1 &&
		SyStrnicmp(pStr->zString, "false", sizeof("FALSE")-1) == 0 ){
			/* FALSE constant are always indexed at 2 */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 2, 0, 0);
			return SXRET_OK;
	}else if(pStr->nByte == sizeof("__LINE__") - 1 &&
		SyMemcmp(pStr->zString, "__LINE__", sizeof("__LINE__")-1) == 0 ){
			/* TICKET 1433-004: __LINE__ constant must be resolved at compile time, not run time */
			pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
			if( pObj == 0 ){
				SXUNUSED(iCompileFlag); /* cc warning */
				return GenStateOutOfMem(pGen);
			}
			jx9MemObjInitFromInt(pGen->pVm, pObj, pToken->nLine);
			/* Emit the load constant instruction */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
			return SXRET_OK;
	}else if( pStr->nByte == sizeof("__FUNCTION__") - 1 &&
		SyMemcmp(pStr->zString, "__FUNCTION__", sizeof("__FUNCTION__")-1) == 0 ){
			GenBlock *pBlock = pGen->pCurrent;
			/* TICKET 1433-004: __FUNCTION__/__METHOD__ constants must be resolved at compile time, not run time */
			while( pBlock && (pBlock->iFlags & GEN_BLOCK_FUNC) == 0 ){
				/* Point to the upper block */
				pBlock = pBlock->pParent;
			}
			if( pBlock == 0 ){
				/* Called in the global scope, load NULL */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
			}else{
				/* Extract the target function/method */
				jx9_vm_func *pFunc = (jx9_vm_func *)pBlock->pUserData;
				pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
				if( pObj == 0 ){
					return GenStateOutOfMem(pGen);
				}
				jx9MemObjInitFromString(pGen->pVm, pObj, &pFunc->sName);
				/* Emit the load constant instruction */
				jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
			}
			return SXRET_OK;
	}
	/* Query literal table */
	if( SXRET_OK != GenStateFindLiteral(&(*pGen), &pToken->sData, &nIdx) ){
		jx9_value *pObj;
		/* Unknown literal, install it in the literal table */
		pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
		if( pObj == 0 ){
			return GenStateOutOfMem(pGen);
		}
		jx9MemObjInitFromString(pGen->pVm, pObj, &pToken->sData);
		GenStateInstallLiteral(&(*pGen), pObj, nIdx);
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm,JX9_OP_LOADC,1,nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}